

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::
step_fill<pugi::impl::(anonymous_namespace)::axis_to_type<(pugi::impl::(anonymous_namespace)::axis_t)1>_>
          (xpath_ast_node *this,xpath_node_set_raw *ns,long *xn,xpath_allocator *alloc,byte once)

{
  xml_node_struct **ppxVar1;
  xml_attribute_struct *a;
  bool bVar2;
  xml_node_struct *in_RAX;
  xml_node xVar3;
  xml_node local_38;
  
  if (xn[1] == 0) {
    local_38._root = (xml_node_struct *)*xn;
  }
  else {
    local_38._root = in_RAX;
    xml_node::xml_node(&local_38);
  }
  if (local_38._root == (xml_node_struct *)0x0) {
    if ((xn[1] != 0) && (*xn != 0)) {
      a = (xml_attribute_struct *)xn[1];
      if (a == (xml_attribute_struct *)0x0) {
        if (*xn == 0) {
          xml_node::xml_node(&local_38);
          xVar3._root = local_38._root;
        }
        else {
          xml_node::xml_node(&local_38,*(xml_node_struct **)(*xn + 0x18));
          xVar3._root = local_38._root;
        }
      }
      else {
        xVar3._root = (xml_node_struct *)*xn;
      }
      if (this->_test != '\x02') goto LAB_001a45bd;
      bVar2 = step_push(this,ns,a,xVar3._root,alloc);
      if ((xVar3._root != (xml_node_struct *)0x0) && ((bVar2 & once) == 0)) {
        do {
          bVar2 = step_push(this,ns,xVar3._root,alloc);
          if ((bVar2 & once) != 0) {
            return;
          }
          xVar3._root = (xVar3._root)->parent;
LAB_001a45bd:
        } while (xVar3._root != (xml_node_struct *)0x0);
      }
    }
  }
  else {
    if (xn[1] == 0) {
      xVar3._root = (xml_node_struct *)*xn;
      local_38._root = xVar3._root;
    }
    else {
      xml_node::xml_node(&local_38);
      xVar3._root = local_38._root;
    }
    do {
      bVar2 = step_push(this,ns,xVar3._root,alloc);
      if ((bVar2 & once) != 0) {
        return;
      }
      ppxVar1 = &(xVar3._root)->parent;
      xVar3._root = *ppxVar1;
    } while (*ppxVar1 != (xml_node_struct *)0x0);
  }
  return;
}

Assistant:

void step_fill(xpath_node_set_raw& ns, const xpath_node& xn, xpath_allocator* alloc, bool once, T v)
		{
			const axis_t axis = T::axis;
			const bool axis_has_attributes = (axis == axis_ancestor || axis == axis_ancestor_or_self || axis == axis_descendant_or_self || axis == axis_following || axis == axis_parent || axis == axis_preceding || axis == axis_self);

			if (xn.node())
				step_fill(ns, xn.node().internal_object(), alloc, once, v);
			else if (axis_has_attributes && xn.attribute() && xn.parent())
				step_fill(ns, xn.attribute().internal_object(), xn.parent().internal_object(), alloc, once, v);
		}